

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O1

void auto_arima_exec(auto_arima_object obj,double *inp,double *xreg)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  sarimax_wrapper_object psVar4;
  sarimax_object psVar5;
  aa_ret_object object;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int r;
  double *pdVar14;
  int *start_00;
  int iVar15;
  uint uVar16;
  int *in_stack_fffffffffffffed8;
  int local_98;
  int local_94;
  int start [4];
  int order [3];
  int seasonal [3];
  int *local_48;
  int *local_40;
  int *seasonalmax;
  int *maxcoeff;
  char *test;
  
  start[2] = obj->pmax;
  start[3] = obj->dmax;
  order[0] = obj->qmax;
  order[1] = obj->Pmax;
  order[2] = obj->Dmax;
  local_98 = obj->p_start;
  start_00 = &local_98;
  local_94 = obj->q_start;
  start[0] = obj->P_start;
  start[1] = obj->Q_start;
  maxcoeff = &obj->Order_max;
  iVar10 = obj->N;
  iVar8 = obj->s;
  local_48 = &obj->num_models;
  local_40 = &obj->approximation;
  r = obj->r;
  test = obj->test;
  seasonalmax = order + 1;
  object = auto_arima1(inp,iVar10,start + 2,seasonalmax,maxcoeff,iVar8,(int *)0x0,(int *)0x0,
                       start_00,&obj->stationary,in_stack_fffffffffffffed8,obj->information_criteria
                       ,&obj->stepwise,local_48,local_40,&obj->method,xreg,r,test,obj->type,
                       &obj->alpha_test,obj->seas,&obj->alpha_seas,&obj->idrift,&obj->imean,
                       obj->verbose,(double *)0x0);
  iVar6 = (int)seasonalmax;
  iVar11 = (int)inp;
  iVar12 = (int)maxcoeff;
  iVar13 = (int)test;
  if (object->otype == 1) {
    psVar4 = (sarimax_wrapper_object)object->myarima;
    psVar5 = psVar4->sarimax;
    iVar10 = psVar5->N;
    iVar8 = psVar5->p;
    iVar13 = psVar5->d;
    iVar12 = psVar5->q;
    uVar1 = psVar5->P;
    r = psVar5->D;
    uVar2 = psVar5->Q;
    uVar3 = psVar5->s;
    iVar11 = psVar5->M;
    iVar6 = psVar5->retval;
    obj->mean = psVar5->mean;
    obj->var = psVar5->var;
    obj->loglik = psVar5->loglik;
    obj->idrift = psVar4->idrift;
    iVar15 = uVar1 + uVar2 + iVar12 + iVar8 + iVar11;
    iVar7 = (iVar10 - (uVar3 * r + iVar13)) + iVar15;
    uVar16 = iVar15 * iVar15 + iVar7;
    if (uVar16 != 0 && SCARRY4(iVar15 * iVar15,iVar7) == (int)uVar16 < 0) {
      uVar9 = 0;
      do {
        *(undefined8 *)(&obj[1].N + uVar9 * 2) = *(undefined8 *)(&psVar5[1].N + uVar9 * 2);
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar16);
    }
    obj->sigma2 = psVar4->sigma2;
    obj->aic = psVar4->bic;
    obj->bic = psVar4->aicc;
    pdVar14 = &psVar4->lambda;
  }
  else {
    if (object->otype != 2) goto LAB_001078ac;
    psVar4 = object->Arima;
    psVar5 = psVar4->sarimax;
    iVar10 = psVar5->N;
    iVar8 = psVar5->p;
    iVar13 = psVar5->d;
    iVar12 = psVar5->q;
    uVar1 = psVar5->P;
    r = psVar5->D;
    uVar2 = psVar5->Q;
    uVar3 = psVar5->s;
    iVar11 = psVar5->M;
    iVar6 = psVar5->retval;
    obj->mean = psVar5->mean;
    obj->var = psVar5->var;
    obj->loglik = psVar5->loglik;
    obj->idrift = psVar4->idrift;
    iVar15 = uVar1 + uVar2 + iVar12 + iVar8 + iVar11;
    iVar7 = (iVar10 - (uVar3 * r + iVar13)) + iVar15;
    uVar16 = iVar15 * iVar15 + iVar7;
    if (uVar16 != 0 && SCARRY4(iVar15 * iVar15,iVar7) == (int)uVar16 < 0) {
      uVar9 = 0;
      do {
        *(undefined8 *)(&obj[1].N + uVar9 * 2) = *(undefined8 *)(&psVar5[1].N + uVar9 * 2);
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar16);
    }
    obj->sigma2 = psVar4->sigma2;
    obj->aic = psVar4->aic;
    obj->bic = psVar4->bic;
    pdVar14 = &psVar4->aicc;
  }
  local_40 = (int *)(ulong)uVar1;
  local_48 = (int *)(ulong)uVar2;
  start_00 = (int *)(ulong)uVar3;
  obj->aicc = *pdVar14;
  obj->sigma2 = psVar4->sigma2;
LAB_001078ac:
  obj->p = iVar8;
  obj->d = iVar13;
  obj->q = iVar12;
  obj->N = iVar10;
  obj->s = (int)start_00;
  obj->P = (int)local_40;
  obj->D = r;
  obj->Q = (int)local_48;
  iVar10 = iVar10 - ((int)start_00 * r + iVar13);
  obj->Nused = iVar10;
  obj->M = iVar11;
  obj->retval = iVar6;
  obj->phi = (double *)(obj + 1);
  obj->theta = (double *)(&obj[1].N + (long)iVar8 * 2);
  obj->PHI = (double *)(&obj[1].N + (long)(iVar8 + iVar12) * 2);
  iVar8 = iVar8 + iVar12 + (int)local_40;
  obj->THETA = (double *)(&obj[1].N + (long)iVar8 * 2);
  iVar8 = iVar8 + (int)local_48;
  obj->exog = (double *)(&obj[1].N + (long)iVar8 * 2);
  iVar8 = iVar8 + iVar11;
  obj->res = (double *)(&obj[1].N + (long)iVar8 * 2);
  obj->vcov = (double *)(&obj[1].N + (long)(iVar10 + iVar8) * 2);
  obj->lvcov = iVar8 * iVar8;
  obj->ncoeff = iVar8;
  aa_ret_free(object);
  return;
}

Assistant:

void auto_arima_exec(auto_arima_object obj, double *inp,double *xreg) {
	aa_ret_object fit;
	int p,d,q,P,D,Q,s,r,N,M;
	int i,imean,idrift, retval, iter;
	int order[3];
	int seasonal[3];
	int start[4];

	order[0] = obj->pmax;
	order[1] = obj->dmax;
	order[2] = obj->qmax;
	seasonal[0] = obj->Pmax;
	seasonal[1] = obj->Dmax;
	seasonal[2] = obj->Qmax;
	start[0] = obj->p_start;
	start[1] = obj->q_start;
	start[2] = obj->P_start;
	start[3] = obj->Q_start;

	fit = auto_arima1(inp,obj->N,order,seasonal,&obj->Order_max,obj->s,NULL,NULL,start,&obj->stationary,&obj->seasonal, obj->information_criteria,
	 &obj->stepwise,&obj->num_models,&obj->approximation,&obj->method,xreg,obj->r,obj->test,obj->type, &obj->alpha_test,obj->seas, &obj->alpha_seas,
	 &obj->idrift, &obj->imean,obj->verbose, NULL);

	imean = obj->imean;
	idrift = obj->idrift;

	if (fit->otype == 2) {
		p = fit->Arima->sarimax->p;
		d = fit->Arima->sarimax->d;
		q = fit->Arima->sarimax->q;
		P = fit->Arima->sarimax->P;
		D = fit->Arima->sarimax->D;
		Q = fit->Arima->sarimax->Q;
		// r = fit->Arima->sarimax->r;
		s = fit->Arima->sarimax->s;
		M = fit->Arima->sarimax->M;
		N = fit->Arima->sarimax->N;
		retval = fit->Arima->sarimax->retval;
		obj->mean = fit->Arima->sarimax->mean;
	    obj->var = fit->Arima->sarimax->var;
		obj->loglik = fit->Arima->sarimax->loglik;
		obj->idrift = fit->Arima->idrift;

		iter = (p + q + P + Q + M + N - d - s*D) + (p + q + P + Q + M )*(p + q + P + Q + M );

		for(i = 0; i < iter; ++i) {
			obj->params[i] = fit->Arima->sarimax->params[i];
		}

		obj->sigma2 = fit->Arima->sigma2;
		obj->aic = fit->Arima->aic;
		obj->bic = fit->Arima->bic;
		obj->aicc = fit->Arima->aicc;
		obj->sigma2 = fit->Arima->sigma2;
		
	} else if (fit->otype == 1) {
		p = fit->myarima->sarimax->p;
		d = fit->myarima->sarimax->d;
		q = fit->myarima->sarimax->q;
		P = fit->myarima->sarimax->P;
		D = fit->myarima->sarimax->D;
		Q = fit->myarima->sarimax->Q;
		// r = fit->myarima->sarimax->r;
		s = fit->myarima->sarimax->s;
		M = fit->myarima->sarimax->M;
		N = fit->myarima->sarimax->N;
		retval = fit->myarima->sarimax->retval;
		obj->mean = fit->myarima->sarimax->mean;
	    obj->var = fit->myarima->sarimax->var;
		obj->loglik = fit->myarima->sarimax->loglik;
		obj->idrift = fit->myarima->idrift;

		iter = (p + q + P + Q + M + N - d - s*D) + (p + q + P + Q + M )*(p + q + P + Q + M );

		for(i = 0; i < iter; ++i) {
			obj->params[i] = fit->myarima->sarimax->params[i];
		}
		obj->sigma2 = fit->myarima->sigma2;
		obj->aic = fit->myarima->aic;
		obj->bic = fit->myarima->bic;
		obj->aicc = fit->myarima->aicc;
		obj->sigma2 = fit->myarima->sigma2;
	}


	obj->p = p;
	obj->d = d;
	obj->q = q;
	obj->N = N;
	obj->s = s;
	obj->P = P;
	obj->D = D;
	obj->Q = Q;
	obj->Nused = N - d - s*D;
	obj->M = M;
	// bug fix: do not set regressor
	// to inner sarimax which can create it's own
	// exogenous variables that do not necessairly align
	// with exogenous variables defined in model obj
	// obj->r = r;
	obj->retval = retval;
	

	obj->phi = &obj->params[0];
	obj->theta = &obj->params[p];
	obj->PHI = &obj->params[p + q];
	obj->THETA = &obj->params[p + q + P];
	obj->exog = &obj->params[p + q + P + Q];
	obj->res = &obj->params[p + q + P + Q + M];
	obj->vcov = &obj->params[p + q + P + Q + M + N - d - s*D];

	obj->lvcov = (p + q + P + Q + M )*(p + q + P + Q + M );
	obj->ncoeff = p + q + P + Q + M ;

	//aa_ret_summary(fit);

	aa_ret_free(fit);
}